

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O2

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint32_t *puVar6;
  long lVar7;
  long lVar8;
  mbedtls_aes_context cty;
  mbedtls_aes_context local_150;
  
  switchD_004a0b15::default(&local_150,0,0x120);
  ctx->rk_offset = 0;
  iVar3 = mbedtls_aes_setkey_enc(&local_150,key,keybits);
  if (iVar3 == 0) {
    uVar5 = (ulong)local_150.nr;
    ctx->nr = local_150.nr;
    puVar4 = local_150.buf + local_150.rk_offset + uVar5 * 4 + -4;
    uVar2 = *(undefined8 *)(local_150.buf + local_150.rk_offset + uVar5 * 4 + 2);
    *(undefined8 *)ctx->buf = *(undefined8 *)(local_150.buf + local_150.rk_offset + uVar5 * 4);
    *(undefined8 *)(ctx->buf + 2) = uVar2;
    puVar6 = ctx->buf + 4;
    while (1 < (int)uVar5) {
      uVar5 = (ulong)((int)uVar5 - 1);
      lVar7 = 0;
      for (lVar8 = 0; (int)lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar1 = puVar4[lVar8];
        puVar6[lVar8] =
             RT1[FSb[uVar1 >> 8 & 0xff]] ^ RT0[FSb[uVar1 & 0xff]] ^ RT2[FSb[uVar1 >> 0x10 & 0xff]] ^
             RT3[FSb[uVar1 >> 0x18]];
        lVar7 = lVar7 + -4;
      }
      puVar4 = (uint32_t *)((long)puVar4 + (-0x20 - lVar7));
      puVar6 = (uint32_t *)((long)puVar6 - lVar7);
    }
    *puVar6 = *puVar4;
    puVar6[1] = puVar4[1];
    puVar6[2] = puVar4[2];
    puVar6[3] = puVar4[3];
  }
  mbedtls_aes_free(&local_150);
  return iVar3;
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}